

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

unsigned_short ExtractShort(uchar *in)

{
  return *(ushort *)in << 8 | *(ushort *)in >> 8;
}

Assistant:

unsigned short ExtractShort(const unsigned char* in)
{
   unsigned short return_value;
#ifdef BIG_ENDIAN
   return_value = in[1]
      + (in[0] << 8);
#else
   return_value = in[0]
      + (in[1] << 8);

#endif

   return return_value;
}